

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O0

map2json_tree_t * map2json_getArrayObject(map2json_tree_t *obj,long arrayId)

{
  long in_RSI;
  map2json_tree_t *in_RDI;
  map2json_tree_t *arrObj;
  s_map2json_tree *local_20;
  map2json_tree_t *local_8;
  
  local_8 = in_RDI;
  if (in_RSI != -2) {
    for (local_20 = in_RDI->arrayObjects; local_20 != (s_map2json_tree *)0x0;
        local_20 = local_20->arrayObjects) {
      if (local_20->arrayId == in_RSI) {
        return local_20;
      }
    }
    local_8 = map2json_createEmptyTreeObject((char *)in_RDI);
    if (in_RDI->maxArrayId < in_RSI) {
      in_RDI->maxArrayId = in_RSI + 1;
    }
    local_8->arrayId = in_RSI;
    local_8->arrayObjects = in_RDI->arrayObjects;
    in_RDI->arrayObjects = local_8;
  }
  return local_8;
}

Assistant:

static map2json_tree_t *map2json_getArrayObject(map2json_tree_t *obj, long arrayId) {
	map2json_tree_t *arrObj;

	if ( arrayId == ARRAYID_IS_COUNT ) {
		return obj;
	}

	arrObj = obj->arrayObjects;
	while ( arrObj != NULL ) {
		if ( arrObj->arrayId == arrayId ) {
			return arrObj;
		}
		arrObj = arrObj->arrayObjects;

	}
	arrObj = map2json_createEmptyTreeObject(NULL);
	if ( obj->maxArrayId < arrayId ) {
		obj->maxArrayId = arrayId + 1;
	}
	arrObj->arrayId = arrayId;
	arrObj->arrayObjects = obj->arrayObjects;
	obj->arrayObjects = arrObj;

	return arrObj;
}